

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnMemory
          (SharedValidator *this,Location *loc,Limits *limits,uint32_t page_size)

{
  bool bVar1;
  size_type sVar2;
  uint64_t num_bytes;
  MemoryType local_68;
  Enum local_4c;
  Enum local_48;
  Enum local_44;
  uint64_t local_40;
  uint64_t absolute_max;
  Enum local_30;
  uint32_t local_2c;
  Limits *pLStack_28;
  uint32_t page_size_local;
  Limits *limits_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_2c = page_size;
  pLStack_28 = limits;
  limits_local = (Limits *)loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  sVar2 = std::
          vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
          ::size(&this->memories_);
  if ((sVar2 != 0) && (bVar1 = Features::multi_memory_enabled((Features *)this), !bVar1)) {
    local_30 = (Enum)PrintError(this,(Location *)limits_local,"only one memory block allowed");
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
  }
  if (local_2c != 0x10000) {
    bVar1 = Features::custom_page_sizes_enabled((Features *)this);
    if (bVar1) {
      if (local_2c != 1) {
        absolute_max._0_4_ =
             PrintError(this,(Location *)limits_local,"only page sizes of 1 B or 64 KiB are allowed"
                       );
        Result::operator|=((Result *)((long)&this_local + 4),absolute_max._0_4_);
      }
    }
    else {
      absolute_max._4_4_ =
           PrintError(this,(Location *)limits_local,"only default page size (64 KiB) is allowed");
      Result::operator|=((Result *)((long)&this_local + 4),absolute_max._4_4_);
    }
  }
  num_bytes = 0xffffffff;
  if ((pLStack_28->is_64 & 1U) != 0) {
    num_bytes = 0xffffffffffffffff;
  }
  local_40 = WABT_BYTES_TO_MIN_PAGES(num_bytes,local_2c);
  local_44 = (Enum)CheckLimits(this,(Location *)limits_local,pLStack_28,local_40,"pages");
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_44);
  if ((pLStack_28->is_shared & 1U) != 0) {
    bVar1 = Features::threads_enabled((Features *)this);
    if (bVar1) {
      if ((pLStack_28->has_max & 1U) == 0) {
        local_4c = (Enum)PrintError(this,(Location *)limits_local,
                                    "shared memories must have max sizes");
        Result::operator|=((Result *)((long)&this_local + 4),(Result)local_4c);
      }
    }
    else {
      local_48 = (Enum)PrintError(this,(Location *)limits_local,"memories may not be shared");
      Result::operator|=((Result *)((long)&this_local + 4),(Result)local_48);
    }
  }
  MemoryType::MemoryType(&local_68,*pLStack_28);
  std::vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
  ::push_back(&this->memories_,&local_68);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnMemory(const Location& loc,
                                 const Limits& limits,
                                 uint32_t page_size) {
  Result result = Result::Ok;
  if (memories_.size() > 0 && !options_.features.multi_memory_enabled()) {
    result |= PrintError(loc, "only one memory block allowed");
  }

  if (page_size != WABT_DEFAULT_PAGE_SIZE) {
    if (!options_.features.custom_page_sizes_enabled()) {
      result |= PrintError(loc, "only default page size (64 KiB) is allowed");
    } else if (page_size != 1) {
      result |= PrintError(loc, "only page sizes of 1 B or 64 KiB are allowed");
    }
  }

  uint64_t absolute_max = WABT_BYTES_TO_MIN_PAGES(
      (limits.is_64 ? UINT64_MAX : UINT32_MAX), page_size);
  result |= CheckLimits(loc, limits, absolute_max, "pages");

  if (limits.is_shared) {
    if (!options_.features.threads_enabled()) {
      result |= PrintError(loc, "memories may not be shared");
    } else if (!limits.has_max) {
      result |= PrintError(loc, "shared memories must have max sizes");
    }
  }

  memories_.push_back(MemoryType{limits});
  return result;
}